

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

int uv_timer_start(uv_timer_t *handle,uv_timer_cb cb,uint64_t timeout,uint64_t repeat)

{
  void **ha;
  uint *puVar1;
  anon_struct_16_2_d918446b_for_timer_heap *heap;
  uv_loop_t *puVar2;
  heap_node *hb;
  anon_struct_16_2_d918446b_for_timer_heap *paVar3;
  int iVar4;
  uint64_t uVar5;
  uint uVar6;
  uint uVar7;
  anon_struct_16_2_d918446b_for_timer_heap *paVar8;
  anon_struct_16_2_d918446b_for_timer_heap *paVar9;
  
  if (cb == (uv_timer_cb)0x0 || (handle->flags & 3) != 0) {
    iVar4 = -0x16;
  }
  else {
    if ((handle->flags & 4) != 0) {
      uv_timer_stop(handle);
    }
    puVar2 = handle->loop;
    uVar5 = 0xffffffffffffffff;
    if (!CARRY8(timeout,puVar2->time)) {
      uVar5 = timeout + puVar2->time;
    }
    handle->timer_cb = cb;
    handle->timeout = uVar5;
    handle->repeat = repeat;
    uVar5 = puVar2->timer_counter;
    puVar2->timer_counter = uVar5 + 1;
    handle->start_id = uVar5;
    puVar2 = handle->loop;
    ha = handle->heap_node;
    handle->heap_node[0] = (void *)0x0;
    handle->heap_node[1] = (void *)0x0;
    handle->heap_node[2] = (void *)0x0;
    iVar4 = 0;
    uVar6 = 0;
    for (uVar7 = (puVar2->timer_heap).nelts + 1; 1 < uVar7; uVar7 = uVar7 >> 1) {
      uVar6 = (uVar7 & 1) + uVar6 * 2;
      iVar4 = iVar4 + -1;
    }
    heap = &puVar2->timer_heap;
    paVar3 = heap;
    paVar9 = heap;
    for (; paVar8 = paVar3, iVar4 != 0; iVar4 = iVar4 + 1) {
      uVar7 = uVar6 * 8;
      uVar6 = uVar6 >> 1;
      paVar3 = (anon_struct_16_2_d918446b_for_timer_heap *)((ulong)(uVar7 & 8) + (long)paVar8->min);
      paVar9 = paVar8;
    }
    handle->heap_node[2] = paVar9->min;
    paVar8->min = ha;
    puVar1 = &(puVar2->timer_heap).nelts;
    *puVar1 = *puVar1 + 1;
    while (hb = (heap_node *)handle->heap_node[2], hb != (heap_node *)0x0) {
      iVar4 = timer_less_than((heap_node *)ha,hb);
      if (iVar4 == 0) break;
      heap_node_swap((heap *)heap,hb,(heap_node *)ha);
    }
    uVar6 = handle->flags;
    iVar4 = 0;
    if (((uVar6 & 4) == 0) && (handle->flags = uVar6 | 4, (uVar6 & 8) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
  }
  return iVar4;
}

Assistant:

int uv_timer_start(uv_timer_t* handle,
                   uv_timer_cb cb,
                   uint64_t timeout,
                   uint64_t repeat) {
  uint64_t clamped_timeout;

  if (uv__is_closing(handle) || cb == NULL)
    return UV_EINVAL;

  if (uv__is_active(handle))
    uv_timer_stop(handle);

  clamped_timeout = handle->loop->time + timeout;
  if (clamped_timeout < timeout)
    clamped_timeout = (uint64_t) -1;

  handle->timer_cb = cb;
  handle->timeout = clamped_timeout;
  handle->repeat = repeat;
  /* start_id is the second index to be compared in timer_less_than() */
  handle->start_id = handle->loop->timer_counter++;

  heap_insert(timer_heap(handle->loop),
              (struct heap_node*) &handle->heap_node,
              timer_less_than);
  uv__handle_start(handle);

  return 0;
}